

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O0

void __thiscall TRM::Bitmap::BlendPixel(Bitmap *this,uint32_t x,uint32_t y,Color *pixel)

{
  array<unsigned_char,_4UL> local_28;
  array<unsigned_char,_4UL> local_24;
  Color result;
  Color src;
  Color *pixel_local;
  uint32_t y_local;
  uint32_t x_local;
  Bitmap *this_local;
  
  if ((x < this->fWidth) && (y < this->fHeight)) {
    _result = pixel;
    local_24._M_elems = (_Type)GetPixel(this,x,y);
    local_28._M_elems = (_Type)Color::blend((Color *)&local_24,_result);
    SetPixel(this,x,y,(Color *)&local_28);
  }
  return;
}

Assistant:

void Bitmap::BlendPixel(uint32_t x, uint32_t y, Color const &pixel) {
  if (x < 0 || x >= fWidth || y < 0 || y >= fHeight) {
    return;
  }

  auto src = this->GetPixel(x, y);

  auto result = src.blend(pixel);

  SetPixel(x, y, result);
}